

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void wallet::coinselector_tests::coin_grinder_tests_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_ba0;
  pointer local_b98;
  char *local_b90;
  char *local_b88;
  pointer local_b80;
  pointer local_b78;
  char *local_b70;
  char *local_b68;
  pointer local_b60;
  pointer local_b58;
  char *local_b50;
  char *local_b48;
  pointer local_b40;
  pointer local_b38;
  char *local_b30;
  char *local_b28;
  pointer local_b20;
  pointer local_b18;
  char *local_b10;
  char *local_b08;
  basic_wrap_stringstream<char> local_b00;
  coin_grinder_tests t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b08 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"coin_grinder_tests");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_b20 = (pbVar3->_M_dataplus)._M_p;
  local_b18 = local_b20 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x455;
  file.m_begin = (iterator)&local_b10;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_b20,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  coin_grinder_tests::coin_grinder_tests(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b28 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"coin_grinder_tests");
  std::operator<<((ostream *)&local_b00,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b40 = (pbVar3->_M_dataplus)._M_p;
  local_b38 = local_b40 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x455;
  file_00.m_begin = (iterator)&local_b30;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_b40,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b48 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"coin_grinder_tests");
  std::operator<<((ostream *)&local_b00,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b60 = (pbVar3->_M_dataplus)._M_p;
  local_b58 = local_b60 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x455;
  file_01.m_begin = (iterator)&local_b50;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_b60,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  coin_grinder_tests::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b68 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"coin_grinder_tests");
  std::operator<<((ostream *)&local_b00,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b80 = (pbVar3->_M_dataplus)._M_p;
  local_b78 = local_b80 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x455;
  file_02.m_begin = (iterator)&local_b70;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_b80,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b88 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"coin_grinder_tests");
  std::operator<<((ostream *)&local_b00,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_ba0 = (pbVar3->_M_dataplus)._M_p;
  local_b98 = local_ba0 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x455;
  file_03.m_begin = (iterator)&local_b90;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_ba0,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  WalletTestingSetup::~WalletTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(coin_grinder_tests)
{
    // Test Coin Grinder:
    // 1) Insufficient funds, select all provided coins and fail.
    // 2) Exceeded max weight, coin selection always surpasses the max allowed weight.
    // 3) Select coins without surpassing the max weight (some coins surpasses the max allowed weight, some others not)
    // 4) Test that two less valuable UTXOs with a combined lower weight are preferred over a more valuable heavier UTXO
    // 5) Test finding a solution in a UTXO pool with mixed weights
    // 6) Test that the lightest solution among many clones is found
    // 7) Test that lots of tiny UTXOs can be skipped if they are too heavy while there are enough funds in lookahead

    FastRandomContext rand;
    CoinSelectionParams dummy_params{ // Only used to provide the 'avoid_partial' flag.
            rand,
            /*change_output_size=*/34,
            /*change_spend_size=*/68,
            /*min_change_target=*/CENT,
            /*effective_feerate=*/CFeeRate(5000),
            /*long_term_feerate=*/CFeeRate(2000),
            /*discard_feerate=*/CFeeRate(1000),
            /*tx_noinputs_size=*/10 + 34, // static header size + output size
            /*avoid_partial=*/false,
    };

    {
        // #########################################################
        // 1) Insufficient funds, select all provided coins and fail
        // #########################################################
        CAmount target = 49.5L * COIN;
        int max_selection_weight = 10'000; // high enough to not fail for this reason.
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                add_coin(available_coins, wallet, CAmount(1 * COIN));
                add_coin(available_coins, wallet, CAmount(2 * COIN));
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).empty()); // empty means "insufficient funds"
    }

    {
        // ###########################
        // 2) Test max weight exceeded
        // ###########################
        CAmount target = 29.5L * COIN;
        int max_selection_weight = 3000;
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 10; ++j) {
                add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true);
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(!res);
        BOOST_CHECK(util::ErrorString(res).original.find("The inputs size exceeds the maximum weight") != std::string::npos);
    }

    {
        // ###############################################################################################################
        // 3) Test selection when some coins surpass the max allowed weight while others not. --> must find a good solution
        // ################################################################################################################
        CAmount target = 25.33L * COIN;
        int max_selection_weight = 10'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 60; ++j) { // 60 UTXO --> 19,8 BTC total --> 60 × 272 WU = 16320 WU
                add_coin(available_coins, wallet, CAmount(0.33 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            for (int i = 0; i < 10; i++) { // 10 UTXO --> 20 BTC total --> 10 × 272 WU = 2720 WU
                add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true);
            }
            return available_coins;
        });
        BOOST_CHECK(res);
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 37;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 4) Test that two less valuable UTXOs with a combined lower weight are preferred over a more valuable heavier UTXO
        // #################################################################################################################
        CAmount target =  1.9L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true, 148);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 68);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 68);
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(1 * COIN, 1, expected_result);
        add_coin(1 * COIN, 2, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 3;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // ###############################################################################################################
        // 5) Test finding a solution in a UTXO pool with mixed weights
        // ################################################################################################################
        CAmount target = 30L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            for (int j = 0; j < 5; ++j) {
                // Add heavy coins {3, 6, 9, 12, 15}
                add_coin(available_coins, wallet, CAmount((3 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 350);
                // Add medium coins {2, 5, 8, 11, 14}
                add_coin(available_coins, wallet, CAmount((2 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 250);
                // Add light coins {1, 4, 7, 10, 13}
                add_coin(available_coins, wallet, CAmount((1 + 3 * j) * COIN), CFeeRate(5000), 144, false, 0, true, 150);
            }
            return available_coins;
        });
        BOOST_CHECK(res);
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(14 * COIN, 1, expected_result);
        add_coin(13 * COIN, 2, expected_result);
        add_coin(4 * COIN, 3, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 92;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 6) Test that the lightest solution among many clones is found
        // #################################################################################################################
        CAmount target =  9.9L * COIN;
        int max_selection_weight = 400'000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            // Expected Result: 4 + 3 + 2 + 1 = 10 BTC at 400 vB
            add_coin(available_coins, wallet, CAmount(4 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(3 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(2 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 100);
            // Distracting clones:
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(8 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(7 * COIN), CFeeRate(5000), 144, false, 0, true, 800);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(6 * COIN), CFeeRate(5000), 144, false, 0, true, 600);
            }
            for (int j = 0; j < 100; ++j) {
                add_coin(available_coins, wallet, CAmount(5 * COIN), CFeeRate(5000), 144, false, 0, true, 400);
            }
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(4 * COIN, 0, expected_result);
        add_coin(3 * COIN, 0, expected_result);
        add_coin(2 * COIN, 0, expected_result);
        add_coin(1 * COIN, 0, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 38;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }

    {
        // #################################################################################################################
        // 7) Test that lots of tiny UTXOs can be skipped if they are too heavy while there are enough funds in lookahead
        // #################################################################################################################
        CAmount target =  1.9L * COIN;
        int max_selection_weight = 40000; // WU
        const auto& res = CoinGrinder(target, dummy_params, m_node, max_selection_weight, [&](CWallet& wallet) {
            CoinsResult available_coins;
            add_coin(available_coins, wallet, CAmount(1.8 * COIN), CFeeRate(5000), 144, false, 0, true, 2500);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            add_coin(available_coins, wallet, CAmount(1 * COIN), CFeeRate(5000), 144, false, 0, true, 1000);
            for (int j = 0; j < 100; ++j) {
                // make a 100 unique coins only differing by one sat
                add_coin(available_coins, wallet, CAmount(0.01 * COIN + j), CFeeRate(5000), 144, false, 0, true, 110);
            }
            return available_coins;
        });
        SelectionResult expected_result(CAmount(0), SelectionAlgorithm::CG);
        add_coin(1 * COIN, 1, expected_result);
        add_coin(1 * COIN, 2, expected_result);
        BOOST_CHECK(EquivalentResult(expected_result, *res));
        // Demonstrate how following improvements reduce iteration count and catch any regressions in the future.
        size_t expected_attempts = 7;
        BOOST_CHECK_MESSAGE(res->GetSelectionsEvaluated() == expected_attempts, strprintf("Expected %i attempts, but got %i", expected_attempts, res->GetSelectionsEvaluated()));
    }
}